

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fisheye_model.hpp
# Opt level: O3

void __thiscall
FisheyeModel::calibrate
          (FisheyeModel *this,
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          *object_points_list,
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          *image_points_list,Size *image_size,Size *board_size,Size *square_size,int flags,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detected_image_list,string *model_filename)

{
  double avg_reproj_error;
  double dVar1;
  TermCriteria TVar2;
  ostream *poVar3;
  vector<double,_std::allocator<double>_> image_reproj_errors;
  string local_1b8;
  undefined8 local_198;
  undefined8 uStack_190;
  vector<cv::Mat,_std::allocator<cv::Mat>_> tvecs;
  vector<cv::Mat,_std::allocator<cv::Mat>_> rvecs;
  Mat camera_matrix;
  Mat distort_coeffs;
  _OutputArray local_90;
  _OutputArray local_78;
  _InputOutputArray local_60;
  _InputOutputArray local_48;
  
  cv::Mat::Mat(&camera_matrix);
  cv::Mat::Mat(&distort_coeffs);
  local_78.super__InputArray.obj = &rvecs;
  rvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_90.super__InputArray.obj = &tvecs;
  tvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1b8.field_2._M_allocated_capacity = 0;
  local_1b8._M_dataplus._M_p._0_4_ = 0x81040015;
  image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x8104000d);
  local_48.super__OutputArray.super__InputArray.sz.width = 0;
  local_48.super__OutputArray.super__InputArray.sz.height = 0;
  local_48.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_60.super__OutputArray.super__InputArray.sz.width = 0;
  local_60.super__OutputArray.super__InputArray.sz.height = 0;
  local_60.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_78.super__InputArray.sz.width = 0;
  local_78.super__InputArray.sz.height = 0;
  local_78.super__InputArray.flags = 0x2050000;
  local_90.super__InputArray.sz.width = 0;
  local_90.super__InputArray.sz.height = 0;
  local_90.super__InputArray.flags = 0x2050000;
  local_198 = 0xc800000003;
  uStack_190 = 0x3f1a36e2eb1c432d;
  TVar2.epsilon = 0.0001;
  TVar2.type = 3;
  TVar2.maxCount = 200;
  image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)image_points_list;
  local_1b8._M_string_length = (size_type)object_points_list;
  local_60.super__OutputArray.super__InputArray.obj = &distort_coeffs;
  local_48.super__OutputArray.super__InputArray.obj = &camera_matrix;
  avg_reproj_error =
       (double)cv::fisheye::calibrate
                         ((_InputArray *)&local_1b8,(_InputArray *)&image_reproj_errors,
                          (Size_ *)image_size,&local_48,&local_60,&local_78,&local_90,flags,TVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=== Root Mean Square Error ===\n",0x1f);
  poVar3 = std::ostream::_M_insert<double>(avg_reproj_error);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=== Camera Matrix ===\n",0x16);
  cv::operator<<((ostream *)&std::cout,&camera_matrix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=== Distance Coefficients ===\n",0x1e);
  cv::operator<<((ostream *)&std::cout,&distort_coeffs);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = computeReprojectionErrors
                    (this,object_points_list,image_points_list,&rvecs,&tvecs,&camera_matrix,
                     &distort_coeffs,&image_reproj_errors);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=== Recalculted Root Mean Square Error ===\n",0x2b);
  poVar3 = std::ostream::_M_insert<double>(dVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"fisheye_model","");
  BaseModel::saveParamsToXML
            (&this->super_BaseModel,&local_1b8,&camera_matrix,0.0,&distort_coeffs,flags,
             avg_reproj_error,image_size,board_size,square_size,detected_image_list,
             image_points_list,&rvecs,&tvecs,&image_reproj_errors,model_filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  BaseModel::loadParamsFromXML(&this->super_BaseModel,model_filename);
  if (image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&tvecs);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&rvecs);
  cv::Mat::~Mat(&distort_coeffs);
  cv::Mat::~Mat(&camera_matrix);
  return;
}

Assistant:

void calibrate(
    const std::vector<std::vector<cv::Point3f>>& object_points_list,
    const std::vector<std::vector<cv::Point2f>>& image_points_list,
    const cv::Size& image_size,
    const cv::Size& board_size,
    const cv::Size& square_size,
    const int flags,
    const std::vector<std::string>& detected_image_list,
    const std::string& model_filename
  ) {
    cv::Mat camera_matrix, distort_coeffs;
    std::vector<cv::Mat> rvecs, tvecs;
    
    double avg_reproj_error = cv::fisheye::calibrate(
      object_points_list,
      image_points_list,
      image_size,
      camera_matrix,
      distort_coeffs,
      rvecs,
      tvecs,
      flags,
      cv::TermCriteria(cv::TermCriteria::COUNT+cv::TermCriteria::EPS, 200, 0.0001)
    );
    std::cout << "=== Root Mean Square Error ===\n" << avg_reproj_error << "\n";
    std::cout << "=== Camera Matrix ===\n" << camera_matrix << "\n";
    std::cout << "=== Distance Coefficients ===\n" << distort_coeffs << "\n";

    std::vector<double> image_reproj_errors;
    double _avg_reproj_error = this->computeReprojectionErrors(
      object_points_list,
      image_points_list,
      rvecs,
      tvecs,
      camera_matrix,
      distort_coeffs,
      image_reproj_errors
    );
    std::cout << "=== Recalculted Root Mean Square Error ===\n" << _avg_reproj_error << "\n";

    this->saveParamsToXML(
      "fisheye_model",
      camera_matrix,
      0,
      distort_coeffs,
      flags,
      avg_reproj_error,
      image_size,
      board_size,
      square_size,
      detected_image_list,
      image_points_list,
      rvecs,
      tvecs,
      image_reproj_errors,
      model_filename
    );
    
    this->loadParamsFromXML(model_filename);
  }